

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O1

gc_heap_ptr<mjs::function_object> __thiscall
mjs::gc_heap::unsafe_track<mjs::function_object>(gc_heap *this,function_object *val)

{
  uint uVar1;
  long in_RDX;
  long lVar2;
  gc_heap_ptr<mjs::function_object> gVar3;
  
  lVar2 = in_RDX - *(long *)&(val->super_native_object).super_object.class_ >> 3;
  if (((lVar2 - 1U >> 1 < 0x7fffffff) &&
      (uVar1 = (uint)lVar2, *(uint *)&(val->super_native_object).super_object.extensible_ <= uVar1))
     && (uVar1 < (val->super_native_object).native_properties_.pos_)) {
    gVar3 = unsafe_create_from_position<mjs::function_object>(this,(uint32_t)val);
    gVar3.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::function_object>)gVar3.super_gc_heap_ptr_untyped;
  }
  __assert_fail("pos >= 1 && pos < UINT32_MAX && alloc_context_.pos_inside(static_cast<uint32_t>(pos))"
                ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x208,
                "gc_heap_ptr<T> mjs::gc_heap::unsafe_track(const T &) [T = mjs::function_object]");
}

Assistant:

gc_heap_ptr<T> gc_heap::unsafe_track(const T& val) {
    auto pos = reinterpret_cast<const slot*>(&val) - alloc_context_.storage();
    assert(pos >= 1 && pos < UINT32_MAX && alloc_context_.pos_inside(static_cast<uint32_t>(pos)));
    return unsafe_create_from_position<T>(static_cast<uint32_t>(pos));
}